

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_mul>
                (float v0,float *ptr,int size0,int stride0,int size1,int stride1)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  int j;
  float *ptr0;
  int i;
  float sum;
  reduction_op_mul op;
  int local_3c;
  float *local_38;
  int local_2c;
  float local_28;
  reduction_op_mul local_21;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  float *local_10;
  
  local_28 = in_XMM0_Da;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    local_38 = local_10;
    for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
      local_28 = reduction_op_mul::operator()(&local_21,&local_28,local_38);
      local_38 = local_38 + local_18;
    }
    local_10 = local_10 + local_20;
  }
  return local_28;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int stride0, int size1, int stride1)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size1; i++)
    {
        const float* ptr0 = ptr;
        for (int j = 0; j < size0; j++)
        {
            sum = op(sum, *ptr0);
            ptr0 += stride0;
        }
        ptr += stride1;
    }

    return sum;
}